

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QRenderRule::fixupBorder(QRenderRule *this,int nativeWidth)

{
  QSharedDataPointer<QStyleSheetBorderData> *this_00;
  int iVar1;
  QStyleSheetBorderData *pQVar2;
  QStyleSheetBorderImageData *pQVar3;
  QStyleSheetPaletteData *pQVar4;
  undefined8 uVar5;
  char cVar6;
  int i;
  long lVar7;
  byte bVar8;
  long lVar9;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  QSharedDataPointer<QStyleSheetBorderImageData> *this_02;
  long in_FS_OFFSET;
  QBrush color;
  undefined8 local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->bd).d.ptr;
  if (pQVar2 == (QStyleSheetBorderData *)0x0) goto LAB_00356cdf;
  this_00 = &this->bd;
  if ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
  }
  pQVar2 = (this_00->d).ptr;
  if ((pQVar2->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) {
    if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    }
    pQVar2 = (this_00->d).ptr;
    pQVar3 = (pQVar2->bi).d.ptr;
    if ((pQVar3 != (QStyleSheetBorderImageData *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(&pQVar2->bi);
    }
    cVar6 = QPixmap::isNull();
    if (cVar6 == '\0') {
      pQVar2 = (this_00->d).ptr;
      if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      }
      pQVar2 = (this_00->d).ptr;
      pQVar3 = (pQVar2->bi).d.ptr;
      this_02 = &pQVar2->bi;
      if ((pQVar3 != (QStyleSheetBorderImageData *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(this_02);
      }
      pQVar3 = (this_02->d).ptr;
      if (pQVar3->cuts[0] == -1) {
        pQVar2 = (this_00->d).ptr;
        lVar7 = 0;
        do {
          pQVar3->cuts[lVar7] = pQVar2->borders[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
      goto LAB_00356cdf;
    }
  }
  pQVar2 = (this_00->d).ptr;
  if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
     ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
  }
  QSharedDataPointer<QStyleSheetBorderImageData>::reset
            (&((this->bd).d.ptr)->bi,(QStyleSheetBorderImageData *)0x0);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (this->pal).d.ptr;
  this_01 = &this->pal;
  if ((pQVar4 != (QStyleSheetPaletteData *)0x0) &&
     ((__int_type)
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
  }
  pQVar4 = (this_01->d).ptr;
  if (pQVar4 == (QStyleSheetPaletteData *)0x0) {
    QBrush::QBrush((QBrush *)&local_40);
  }
  else {
    if ((__int_type)
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    QBrush::QBrush((QBrush *)&local_40,&((this_01->d).ptr)->foreground);
  }
  pQVar2 = (this_00->d).ptr;
  if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
     ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
  }
  pQVar2 = (this_00->d).ptr;
  if ((pQVar2->radii[0].wd.m_i < 0) || (pQVar2->radii[0].ht.m_i < 0)) {
    if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    }
    pQVar2 = (this_00->d).ptr;
    if ((-1 < pQVar2->radii[1].wd.m_i) && (-1 < pQVar2->radii[1].ht.m_i)) goto LAB_00356b53;
    if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    }
    pQVar2 = (this_00->d).ptr;
    if ((-1 < pQVar2->radii[2].wd.m_i) && (-1 < pQVar2->radii[2].ht.m_i)) goto LAB_00356b53;
    if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    }
    pQVar2 = (this_00->d).ptr;
    bVar8 = (byte)((byte)((uint)pQVar2->radii[3].ht.m_i >> 0x18) |
                  (byte)((uint)pQVar2->radii[3].wd.m_i >> 0x18)) >> 7;
  }
  else {
LAB_00356b53:
    bVar8 = 0;
  }
  lVar9 = 0x18;
  lVar7 = 0;
  do {
    pQVar2 = (this_00->d).ptr;
    if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    }
    pQVar2 = (this_00->d).ptr;
    if (*(int *)((long)pQVar2->styles + lVar7) == 0xc && bVar8 == 0) {
      if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      }
      *(undefined4 *)((long)((this_00->d).ptr)->styles + lVar7) = 1;
    }
    pQVar2 = (this_00->d).ptr;
    if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
    }
    pQVar2 = (this_00->d).ptr;
    iVar1 = *(int *)((long)pQVar2->styles + lVar7);
    if (iVar1 == 0xc) {
      if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      }
      pQVar2 = (this_00->d).ptr;
      if (*(int *)((long)pQVar2->borders + lVar7) == 0) {
        if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
           ((__int_type)
            (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        }
        *(int *)((long)((this_00->d).ptr)->borders + lVar7) = nativeWidth;
      }
LAB_00356c7c:
      pQVar2 = (this_00->d).ptr;
      if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      }
      pQVar2 = (this_00->d).ptr;
      if (*(int *)(*(long *)((long)pQVar2->borders + lVar7 * 2 + 0x14) + 4) == 0) {
        if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
           ((__int_type)
            (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
        }
        QBrush::operator=((QBrush *)((long)((this_00->d).ptr)->borders + lVar9 + -4),
                          (QBrush *)&local_40);
      }
    }
    else {
      if (iVar1 != 1) goto LAB_00356c7c;
      QBrush::QBrush((QBrush *)&local_48);
      pQVar2 = (this_00->d).ptr;
      if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      }
      pQVar2 = (this_00->d).ptr;
      uVar5 = *(undefined8 *)((long)pQVar2->borders + lVar7 * 2 + 0x14);
      *(undefined8 *)((long)pQVar2->borders + lVar7 * 2 + 0x14) = local_48;
      local_48 = uVar5;
      QBrush::~QBrush((QBrush *)&local_48);
      pQVar2 = (this_00->d).ptr;
      if ((pQVar2 != (QStyleSheetBorderData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
      }
      *(undefined4 *)((long)((this_00->d).ptr)->borders + lVar7) = 0;
    }
    lVar7 = lVar7 + 4;
    lVar9 = lVar9 + 8;
  } while (lVar7 != 0x10);
  QBrush::~QBrush((QBrush *)&local_40);
LAB_00356cdf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::fixupBorder(int nativeWidth)
{
    if (bd == nullptr)
        return;

    if (!bd->hasBorderImage() || bd->bi->pixmap.isNull()) {
        bd->bi = nullptr;
        // ignore the color, border of edges that have none border-style
        QBrush color = pal ? pal->foreground : QBrush();
        const bool hasRadius = bd->radii[0].isValid() || bd->radii[1].isValid()
                               || bd->radii[2].isValid() || bd->radii[3].isValid();
        for (int i = 0; i < 4; i++) {
            if ((bd->styles[i] == BorderStyle_Native) && hasRadius)
                bd->styles[i] = BorderStyle_None;

            switch (bd->styles[i]) {
            case BorderStyle_None:
                // border-style: none forces width to be 0
                bd->colors[i] = QBrush();
                bd->borders[i] = 0;
                break;
            case BorderStyle_Native:
                if (bd->borders[i] == 0)
                    bd->borders[i] = nativeWidth;
                Q_FALLTHROUGH();
            default:
                if (bd->colors[i].style() == Qt::NoBrush) // auto-acquire 'color'
                    bd->colors[i] = color;
                break;
            }
        }

        return;
    }

    // inspect the border image
    QStyleSheetBorderImageData *bi = bd->bi;
    if (bi->cuts[0] == -1) {
        for (int i = 0; i < 4; i++) // assume, cut = border
            bi->cuts[i] = int(border()->borders[i]);
    }
}